

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O3

void __thiscall Centaurus::Stage1Runner::thread_runner_impl(Stage1Runner *this)

{
  void *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  this->m_current_bank = -1;
  this->m_counter = 0;
  if (0 < (this->super_BaseRunner).m_bank_num) {
    pvVar1 = (this->super_BaseRunner).m_sub_window;
    lVar3 = 0;
    do {
      LOCK();
      *(undefined4 *)((long)pvVar1 + lVar3 * 8 + 4) = 0;
      UNLOCK();
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_BaseRunner).m_bank_num);
  }
  iVar2 = (*this->m_parser->_vptr_IParser[2])
                    (this->m_parser,this,(this->super_BaseRunner).m_input_window);
  this->m_result = (void *)CONCAT44(extraout_var,iVar2);
  release_bank(this);
  signal_exit(this);
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    m_counter = 0;
    reset_banks();

    m_result = (*m_parser)(static_cast<BaseListener*>(this), m_input_window);

    release_bank();
    signal_exit();
  }